

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O3

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkDefaultCompatibility
          (CompatibilityChecker *this,Reader *value,Reader *replacement)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  undefined2 *puVar4;
  char cVar5;
  long lVar6;
  char cVar7;
  short sVar8;
  long lVar9;
  int iVar10;
  short sVar11;
  int iVar12;
  float fVar13;
  double dVar14;
  float fVar15;
  double dVar16;
  
  uVar2 = (value->_reader).dataSize;
  if (uVar2 < 0x10) {
    sVar8 = 0;
  }
  else {
    sVar8 = *(value->_reader).data;
  }
  uVar3 = (replacement->_reader).dataSize;
  if (uVar3 < 0x10) {
    sVar11 = 0;
  }
  else {
    sVar11 = *(replacement->_reader).data;
  }
  if (sVar8 != sVar11) {
    checkDefaultCompatibility(this);
    return;
  }
  if (uVar2 < 0x10) {
    return;
  }
  puVar4 = (undefined2 *)(value->_reader).data;
  switch(*puVar4) {
  case 1:
    if (uVar2 == 0x10) {
      if (uVar3 < 0x11) {
        return;
      }
      bVar1 = *(byte *)((long)(replacement->_reader).data + 2);
joined_r0x00213265:
      if ((bVar1 & 1) == 0) {
        return;
      }
    }
    else {
      bVar1 = *(byte *)(puVar4 + 1);
      if (uVar3 < 0x11) goto joined_r0x00213265;
      if ((bVar1 & 1) == (*(byte *)((long)(replacement->_reader).data + 2) & 1)) {
        return;
      }
    }
    checkDefaultCompatibility(this);
    break;
  case 2:
    if (uVar2 < 0x18) {
      cVar7 = '\0';
    }
    else {
      cVar7 = *(char *)(puVar4 + 1);
    }
    if (uVar3 < 0x18) {
      cVar5 = '\0';
    }
    else {
      cVar5 = *(char *)((long)(replacement->_reader).data + 2);
    }
    if (cVar7 != cVar5) {
      checkDefaultCompatibility(this);
    }
    break;
  case 3:
    if (uVar2 < 0x20) {
      sVar8 = 0;
    }
    else {
      sVar8 = puVar4[1];
    }
    if (uVar3 < 0x20) {
      sVar11 = 0;
    }
    else {
      sVar11 = *(short *)((long)(replacement->_reader).data + 2);
    }
    if (sVar8 != sVar11) {
      checkDefaultCompatibility(this);
    }
    break;
  case 4:
    iVar10 = 0;
    iVar12 = 0;
    if (0x3f < uVar2) {
      iVar12 = *(int *)(puVar4 + 2);
    }
    if (0x3f < uVar3) {
      iVar10 = *(int *)((long)(replacement->_reader).data + 4);
    }
    if (iVar12 != iVar10) {
      checkDefaultCompatibility(this);
    }
    break;
  case 5:
    if (uVar2 < 0x80) {
      lVar9 = 0;
    }
    else {
      lVar9 = *(long *)(puVar4 + 4);
    }
    if (uVar3 < 0x80) {
      lVar6 = 0;
    }
    else {
      lVar6 = *(long *)((long)(replacement->_reader).data + 8);
    }
    if (lVar9 != lVar6) {
      checkDefaultCompatibility(this);
    }
    break;
  case 6:
    if (uVar2 < 0x18) {
      cVar7 = '\0';
    }
    else {
      cVar7 = *(char *)(puVar4 + 1);
    }
    if (uVar3 < 0x18) {
      cVar5 = '\0';
    }
    else {
      cVar5 = *(char *)((long)(replacement->_reader).data + 2);
    }
    if (cVar7 != cVar5) {
      checkDefaultCompatibility(this);
    }
    break;
  case 7:
    if (uVar2 < 0x20) {
      sVar8 = 0;
    }
    else {
      sVar8 = puVar4[1];
    }
    if (uVar3 < 0x20) {
      sVar11 = 0;
    }
    else {
      sVar11 = *(short *)((long)(replacement->_reader).data + 2);
    }
    if (sVar8 != sVar11) {
      checkDefaultCompatibility(this);
    }
    break;
  case 8:
    iVar10 = 0;
    iVar12 = 0;
    if (0x3f < uVar2) {
      iVar12 = *(int *)(puVar4 + 2);
    }
    if (0x3f < uVar3) {
      iVar10 = *(int *)((long)(replacement->_reader).data + 4);
    }
    if (iVar12 != iVar10) {
      checkDefaultCompatibility(this);
    }
    break;
  case 9:
    if (uVar2 < 0x80) {
      lVar9 = 0;
    }
    else {
      lVar9 = *(long *)(puVar4 + 4);
    }
    if (uVar3 < 0x80) {
      lVar6 = 0;
    }
    else {
      lVar6 = *(long *)((long)(replacement->_reader).data + 8);
    }
    if (lVar9 != lVar6) {
      checkDefaultCompatibility(this);
    }
    break;
  case 10:
    fVar13 = 0.0;
    fVar15 = 0.0;
    if (0x3f < uVar2) {
      fVar15 = *(float *)(puVar4 + 2);
    }
    if (0x3f < uVar3) {
      fVar13 = *(float *)((long)(replacement->_reader).data + 4);
    }
    if ((fVar15 != fVar13) || (NAN(fVar15) || NAN(fVar13))) {
      checkDefaultCompatibility(this);
    }
    break;
  case 0xb:
    dVar14 = 0.0;
    dVar16 = 0.0;
    if (0x7f < uVar2) {
      dVar16 = *(double *)(puVar4 + 4);
    }
    if (0x7f < uVar3) {
      dVar14 = *(double *)((long)(replacement->_reader).data + 8);
    }
    if ((dVar16 != dVar14) || (NAN(dVar16) || NAN(dVar14))) {
      checkDefaultCompatibility(this);
    }
    break;
  case 0xf:
    if (uVar2 < 0x20) {
      sVar8 = 0;
    }
    else {
      sVar8 = puVar4[1];
    }
    if (uVar3 < 0x20) {
      sVar11 = 0;
    }
    else {
      sVar11 = *(short *)((long)(replacement->_reader).data + 2);
    }
    if (sVar8 != sVar11) {
      checkDefaultCompatibility(this);
    }
  }
  return;
}

Assistant:

inline T StructReader::getDataField(StructDataOffset offset) const {
  if ((offset + ONE * ELEMENTS) * capnp::bitsPerElement<T>() <= dataSize) {
    return reinterpret_cast<const WireValue<T>*>(data)[unbound(offset / ELEMENTS)].get();
  } else {
    return static_cast<T>(0);
  }
}